

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O1

double bpser(double *a,double *b,double *x,double *eps)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  bpser::bpser = 0.0;
  if ((*x == 0.0) && (!NAN(*x))) {
    return 0.0;
  }
  bpser::a0 = *a;
  if (*b <= *a) {
    bpser::a0 = *b;
  }
  dVar2 = *a;
  if (1.0 <= bpser::a0) {
    dVar3 = log(*x);
    dVar5 = betaln(a,b);
    dVar2 = exp(dVar2 * dVar3 - dVar5);
    bpser::bpser = dVar2 / *a;
  }
  else {
    bpser::b0 = *b;
    if (*b <= dVar2) {
      bpser::b0 = dVar2;
    }
    if (8.0 <= bpser::b0) {
      dVar2 = gamln1(&bpser::a0);
      dVar3 = algdiv(&bpser::a0,&bpser::b0);
      bpser::u = dVar3 + dVar2;
      dVar2 = *a;
      dVar3 = log(*x);
      dVar5 = bpser::a0 / *a;
      dVar2 = exp(dVar3 * dVar2 - bpser::u);
      bpser::bpser = dVar2 * dVar5;
    }
    else if (bpser::b0 <= 1.0) {
      dVar2 = pow(*x,*a);
      if ((dVar2 == 0.0) && (!NAN(dVar2))) {
        bpser::bpser = dVar2;
        return dVar2;
      }
      bpser::apb = *a + *b;
      bpser::bpser = dVar2;
      if (bpser::apb <= 1.0) {
        dVar3 = gam1(&bpser::apb);
        dVar3 = dVar3 + 1.0;
      }
      else {
        bpser::u = *a + *b + -1.0;
        dVar3 = gam1(&bpser::u);
        dVar3 = (dVar3 + 1.0) / bpser::apb;
      }
      dVar5 = gam1(a);
      dVar4 = gam1(b);
      bpser::bpser = dVar2 * (*b / bpser::apb) * (((dVar4 + 1.0) * (dVar5 + 1.0)) / dVar3);
    }
    else {
      bpser::u = gamln1(&bpser::a0);
      iVar1 = (int)(bpser::b0 + -1.0);
      if (0 < iVar1) {
        dVar2 = 1.0;
        do {
          bpser::b0 = bpser::b0 + -1.0;
          dVar2 = dVar2 * (bpser::b0 / (bpser::b0 + bpser::a0));
          iVar1 = iVar1 + -1;
        } while (iVar1 != 0);
        dVar2 = log(dVar2);
        bpser::u = dVar2 + bpser::u;
      }
      dVar2 = *a;
      dVar3 = log(*x);
      dVar2 = dVar3 * dVar2 - bpser::u;
      bpser::b0 = bpser::b0 + -1.0;
      bpser::apb = bpser::b0 + bpser::a0;
      if (bpser::apb <= 1.0) {
        dVar3 = gam1(&bpser::apb);
        bpser::t = dVar3 + 1.0;
      }
      else {
        bpser::u = bpser::apb + -1.0;
        dVar3 = gam1(&bpser::u);
        bpser::t = (dVar3 + 1.0) / bpser::apb;
      }
      dVar2 = exp(dVar2);
      dVar5 = bpser::a0 / *a;
      dVar3 = gam1(&bpser::b0);
      bpser::bpser = ((dVar3 + 1.0) * dVar5 * dVar2) / bpser::t;
    }
  }
  if ((bpser::bpser != 0.0) || (NAN(bpser::bpser))) {
    dVar2 = *a;
    if (*eps * 0.1 < dVar2) {
      bpser::sum = 0.0;
      dVar3 = 1.0;
      bpser::n = 0.0;
      do {
        bpser::n = bpser::n + 1.0;
        dVar3 = dVar3 * ((0.5 - *b / bpser::n) + 0.5) * *x;
        dVar5 = dVar3 / (dVar2 + bpser::n);
        bpser::sum = bpser::sum + dVar5;
      } while (*eps / dVar2 < ABS(dVar5));
      bpser::bpser = bpser::bpser * (dVar2 * bpser::sum + 1.0);
    }
  }
  return bpser::bpser;
}

Assistant:

double bpser(double *a,double *b,double *x,double *eps)
/*
-----------------------------------------------------------------------
     POWER SERIES EXPANSION FOR EVALUATING IX(A,B) WHEN B .LE. 1
     OR B*X .LE. 0.7.  EPS IS THE TOLERANCE USED.
-----------------------------------------------------------------------
*/
{
static double bpser,a0,apb,b0,c,n,sum,t,tol,u,w,z;
static int i,m;
/*
     ..
     .. Executable Statements ..
*/
    bpser = 0.0e0;
    if(*x == 0.0e0) return bpser;
/*
-----------------------------------------------------------------------
            COMPUTE THE FACTOR X**A/(A*BETA(A,B))
-----------------------------------------------------------------------
*/
    a0 = fifdmin1(*a,*b);
    if(a0 < 1.0e0) goto S10;
    z = *a*log(*x)-betaln(a,b);
    bpser = exp(z)/ *a;
    goto S100;
S10:
    b0 = fifdmax1(*a,*b);
    if(b0 >= 8.0e0) goto S90;
    if(b0 > 1.0e0) goto S40;
/*
            PROCEDURE FOR A0 .LT. 1 AND B0 .LE. 1
*/
    bpser = pow(*x,*a);
    if(bpser == 0.0e0) return bpser;
    apb = *a+*b;
    if(apb > 1.0e0) goto S20;
    z = 1.0e0+gam1(&apb);
    goto S30;
S20:
    u = *a+*b-1.e0;
    z = (1.0e0+gam1(&u))/apb;
S30:
    c = (1.0e0+gam1(a))*(1.0e0+gam1(b))/z;
    bpser *= (c*(*b/apb));
    goto S100;
S40:
/*
         PROCEDURE FOR A0 .LT. 1 AND 1 .LT. B0 .LT. 8
*/
    u = gamln1(&a0);
    m = b0-1.0e0;
    if(m < 1) goto S60;
    c = 1.0e0;
    for(i=1; i<=m; i++) {
        b0 -= 1.0e0;
        c *= (b0/(a0+b0));
    }
    u = log(c)+u;
S60:
    z = *a*log(*x)-u;
    b0 -= 1.0e0;
    apb = a0+b0;
    if(apb > 1.0e0) goto S70;
    t = 1.0e0+gam1(&apb);
    goto S80;
S70:
    u = a0+b0-1.e0;
    t = (1.0e0+gam1(&u))/apb;
S80:
    bpser = exp(z)*(a0/ *a)*(1.0e0+gam1(&b0))/t;
    goto S100;
S90:
/*
            PROCEDURE FOR A0 .LT. 1 AND B0 .GE. 8
*/
    u = gamln1(&a0)+algdiv(&a0,&b0);
    z = *a*log(*x)-u;
    bpser = a0/ *a*exp(z);
S100:
    if(bpser == 0.0e0 || *a <= 0.1e0**eps) return bpser;
/*
-----------------------------------------------------------------------
                     COMPUTE THE SERIES
-----------------------------------------------------------------------
*/
    sum = n = 0.0e0;
    c = 1.0e0;
    tol = *eps/ *a;
S110:
    n += 1.0e0;
    c *= ((0.5e0+(0.5e0-*b/n))**x);
    w = c/(*a+n);
    sum += w;
    if(fabs(w) > tol) goto S110;
    bpser *= (1.0e0+*a*sum);
    return bpser;
}